

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimeInitialize(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkOld)

{
  void **ppvVar1;
  Abc_Time_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_ManTime_t *pAVar4;
  Abc_Time_t *pAVar5;
  int iVar6;
  
  if (pNtkOld != (Abc_Ntk_t *)0x0) {
    if (pNtkOld->pManTime == (Abc_ManTime_t *)0x0) {
      __assert_fail("pNtkOld == NULL || pNtkOld->pManTime != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x156,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtk->vCis->nSize != pNtkOld->vCis->nSize) {
      __assert_fail("pNtkOld == NULL || Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x157,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    if (pNtk->vCos->nSize != pNtkOld->vCos->nSize) {
      __assert_fail("pNtkOld == NULL || Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x158,"void Abc_NtkTimeInitialize(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    iVar6 = 0;
    Abc_ManTimeExpand(pNtk->pManTime,pNtk->vObjs->nSize,0);
    if (pNtkOld != (Abc_Ntk_t *)0x0) {
      pNtk->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
      pNtk->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
      pNtk->AndGateDelay = pNtkOld->AndGateDelay;
    }
    ppvVar1 = pNtk->pManTime->vArrs->pArray;
    for (; iVar6 < pNtk->vCis->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkCi(pNtk,iVar6);
      pAVar2 = (Abc_Time_t *)ppvVar1[pAVar3->Id];
      if (pNtkOld == (Abc_Ntk_t *)0x0) {
        pAVar4 = pNtk->pManTime;
      }
      else {
        pAVar3 = Abc_NtkCi(pNtkOld,iVar6);
        pAVar4 = (Abc_ManTime_t *)Abc_NodeReadArrival(pAVar3);
      }
      *pAVar2 = pAVar4->tArrDef;
    }
    ppvVar1 = pNtk->pManTime->vReqs->pArray;
    for (iVar6 = 0; iVar6 < pNtk->vCos->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,iVar6);
      pAVar2 = (Abc_Time_t *)ppvVar1[pAVar3->Id];
      if (pNtkOld == (Abc_Ntk_t *)0x0) {
        pAVar5 = &pNtk->pManTime->tReqDef;
      }
      else {
        pAVar3 = Abc_NtkCo(pNtkOld,iVar6);
        pAVar5 = Abc_NodeReadRequired(pAVar3);
      }
      *pAVar2 = *pAVar5;
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeInitialize( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkOld )
{
    Abc_Obj_t * pObj;
    Abc_Time_t ** ppTimes;
    int i;
    assert( pNtkOld == NULL || pNtkOld->pManTime != NULL );
    assert( pNtkOld == NULL || Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkOld) );
    assert( pNtkOld == NULL || Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkOld) );
    if ( pNtk->pManTime == NULL )
        return;
    // create timing manager with default values
    Abc_ManTimeExpand( pNtk->pManTime, Abc_NtkObjNumMax(pNtk), 0 );
    // set global defaults from pNtkOld
    if ( pNtkOld )
    {
        pNtk->pManTime->tArrDef = pNtkOld->pManTime->tArrDef;
        pNtk->pManTime->tReqDef = pNtkOld->pManTime->tReqDef;
        pNtk->AndGateDelay = pNtkOld->AndGateDelay;
    }
    // set the default timing for CI and COs
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vArrs->pArray;
    Abc_NtkForEachCi( pNtk, pObj, i )
        *ppTimes[pObj->Id] = pNtkOld ? *Abc_NodeReadArrival(Abc_NtkCi(pNtkOld, i)) : pNtk->pManTime->tArrDef;
    ppTimes = (Abc_Time_t **)pNtk->pManTime->vReqs->pArray;
    Abc_NtkForEachCo( pNtk, pObj, i )
        *ppTimes[pObj->Id] = pNtkOld ? *Abc_NodeReadRequired(Abc_NtkCo(pNtkOld, i)) : pNtk->pManTime->tReqDef;
}